

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

void If_Dec7Verify(word *t,word z)

{
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  undefined8 auStack_138 [16];
  undefined8 auStack_b8 [5];
  code *pcStack_90;
  word r [2];
  word local_78 [7];
  word wStack_40;
  
  if (z != 0) {
    for (lVar3 = 0x10; lVar3 != 0x20; lVar3 = lVar3 + 4) {
      uVar2 = (ulong)(((uint)(z >> ((byte)lVar3 & 0x3f)) & 7) << 4);
      uVar1 = *(undefined8 *)((long)Truth7[0] + uVar2 + 8);
      *(undefined8 *)((long)auStack_b8 + lVar3 * 4) = *(undefined8 *)((long)Truth7[0] + uVar2);
      *(undefined8 *)((long)auStack_b8 + lVar3 * 4 + 8) = uVar1;
    }
    pcStack_90 = (code *)0x37698f;
    If_Dec7ComposeLut4((uint)z & 0xffff,(word (*) [2])local_78,r);
    local_78[6] = r[0];
    wStack_40 = r[1];
    for (lVar3 = 0x30; lVar3 != 0x3c; lVar3 = lVar3 + 4) {
      uVar2 = (ulong)(((uint)(z >> ((byte)lVar3 & 0x3f)) & 7) << 4);
      uVar1 = *(undefined8 *)((long)Truth7[0] + uVar2 + 8);
      *(undefined8 *)((long)auStack_138 + lVar3 * 4) = *(undefined8 *)((long)Truth7[0] + uVar2);
      *(undefined8 *)((long)auStack_138 + lVar3 * 4 + 8) = uVar1;
    }
    pcStack_90 = (code *)0x3769d8;
    If_Dec7ComposeLut4((uint)(z >> 0x20) & 0xffff,(word (*) [2])local_78,r);
    if ((r[0] != *t) || (r[1] != t[1])) {
      pcStack_90 = (code *)0x3769f3;
      If_DecPrintConfig(z);
      pcStack_90 = (code *)0x376a00;
      Kit_DsdPrintFromTruth((uint *)t,7);
      pcStack_90 = (code *)0x376a0a;
      putchar(10);
      pcStack_90 = (code *)0x376a14;
      Kit_DsdPrintFromTruth((uint *)r,7);
      pcStack_90 = (code *)0x376a1b;
      putchar(10);
      pcStack_90 = (code *)0x376a27;
      puts("Verification failed!");
    }
    return;
  }
  pcStack_90 = If_Dec7ComposeLut4;
  __assert_fail("z",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                ,0xb2,"void If_Dec7Verify(word *, word)");
}

Assistant:

void If_Dec7Verify( word t[2], word z )
{
    word f[4][2], r[2];
    int i, v;
    assert( z );
    for ( i = 0; i < 4; i++ )
    {
        v = (z >> (16+(i<<2))) & 7;
        f[i][0] = Truth7[v][0];
        f[i][1] = Truth7[v][1];
    }
    If_Dec7ComposeLut4( (int)(z & 0xffff), f, r );
    f[3][0] = r[0];
    f[3][1] = r[1];
    for ( i = 0; i < 3; i++ )
    {
        v = (z >> (48+(i<<2))) & 7;
        f[i][0] = Truth7[v][0];
        f[i][1] = Truth7[v][1];
    }
    If_Dec7ComposeLut4( (int)((z >> 32) & 0xffff), f, r );
    if ( r[0] != t[0] || r[1] != t[1] )
    {
        If_DecPrintConfig( z );
        Kit_DsdPrintFromTruth( (unsigned*)t, 7 ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)r, 7 ); printf( "\n" );
        printf( "Verification failed!\n" );
    }
}